

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O3

void amrex::mlndlap_bc_doit<double>
               (Box *vbx,Array4<double> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  double *pdVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int idim;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  double *pdVar70;
  int iVar71;
  long lVar72;
  int iVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  int iVar78;
  long lVar79;
  long lVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  Box gdomain;
  int local_29c;
  int local_258;
  int local_254;
  undefined8 local_168;
  int local_160;
  int local_15c [2];
  undefined8 uStack_154;
  
  uVar8 = *(undefined8 *)((domain->smallend).vect + 2);
  local_15c[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  uStack_154 = *(undefined8 *)((domain->bigend).vect + 2);
  local_168 = *(undefined8 *)(domain->smallend).vect;
  local_160 = (int)uVar8;
  local_15c[0] = (int)((ulong)uVar8 >> 0x20);
  lVar32 = 0;
  do {
    if (bflo->arr[lVar32] == false) {
      piVar5 = (int *)((long)&local_168 + lVar32 * 4);
      *piVar5 = *piVar5 + -1;
    }
    if (bfhi->arr[lVar32] == false) {
      local_15c[lVar32] = local_15c[lVar32] + 1;
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 3);
  iVar14 = (vbx->smallend).vect[0];
  iVar15 = (vbx->smallend).vect[1];
  if ((((iVar14 <= (int)local_168) || (iVar15 <= local_168._4_4_)) ||
      ((vbx->smallend).vect[2] <= local_160)) ||
     (((local_15c[0] <= (vbx->bigend).vect[0] || (local_15c[1] <= (vbx->bigend).vect[1])) ||
      ((int)uStack_154 <= (vbx->bigend).vect[2])))) {
    iVar16 = (vbx->smallend).vect[2];
    iVar39 = (vbx->bigend).vect[2] + 1;
    if (iVar16 + -1 <= iVar39) {
      iVar1 = iVar14 + -1;
      iVar17 = (vbx->bigend).vect[0];
      bVar81 = (domain->btype).itype != 0;
      iVar25 = (vbx->bigend).vect[1] + 1;
      iVar18 = (domain->bigend).vect[0];
      iVar26 = (domain->smallend).vect[0] + -1;
      iVar42 = (domain->smallend).vect[1] + -1;
      iVar51 = (domain->smallend).vect[2] + -1;
      iVar78 = (domain->bigend).vect[1] + 1;
      iVar49 = (domain->bigend).vect[2] + 1;
      uVar55 = (uint)bVar81;
      lVar66 = (long)iVar1;
      lVar76 = (long)iVar26;
      lVar32 = (long)(iVar18 + 1);
      lVar33 = lVar32 - lVar66;
      lVar34 = lVar76 - lVar66;
      local_258 = (uint)bVar81 + iVar16;
      iVar62 = (iVar16 - uVar55) + -2;
      iVar53 = (iVar14 - uVar55) + -2;
      iVar27 = bVar81 + 1;
      iVar26 = iVar26 + iVar27;
      iVar16 = iVar16 + -1;
      do {
        if (iVar15 + -1 <= iVar25) {
          lVar35 = (long)iVar16;
          iVar28 = ~(uint)bVar81 + iVar16;
          iVar29 = iVar27 + iVar16;
          local_29c = (iVar15 - uVar55) + -2;
          local_254 = (uint)bVar81 + iVar15;
          iVar23 = iVar15 + -1;
          do {
            if (iVar1 <= iVar17 + 1) {
              lVar74 = (long)iVar23;
              bVar83 = iVar16 == iVar49;
              bVar84 = iVar16 == iVar51;
              bVar85 = iVar23 == iVar42;
              bVar86 = iVar23 == iVar78;
              pdVar21 = a->p;
              lVar22 = a->jstride;
              iVar19 = (a->begin).x;
              lVar77 = (long)iVar19;
              iVar20 = (a->begin).y;
              lVar43 = (iVar23 - iVar20) * lVar22;
              iVar30 = (a->begin).z;
              lVar63 = a->kstride;
              lVar58 = (iVar16 - iVar30) * lVar63;
              lVar60 = lVar63 * (iVar51 - iVar30);
              lVar61 = (iVar29 - iVar30) * lVar63;
              lVar67 = lVar63 * (iVar49 - iVar30);
              lVar68 = (iVar28 - iVar30) * lVar63;
              lVar63 = lVar63 * 8;
              lVar41 = (iVar51 - iVar30) * lVar63;
              lVar75 = (local_258 - iVar30) * lVar63;
              lVar36 = (iVar49 - iVar30) * lVar63;
              lVar44 = (iVar62 - iVar30) * lVar63;
              lVar63 = (lVar35 - iVar30) * lVar63;
              iVar56 = iVar27 + iVar23;
              iVar50 = iVar23 + ~(uint)bVar81;
              lVar45 = lVar22 * 8;
              lVar54 = (iVar42 - iVar20) * lVar45;
              lVar59 = (local_254 - iVar20) * lVar45;
              lVar52 = (iVar78 - iVar20) * lVar45;
              lVar64 = (local_29c - iVar20) * lVar45;
              lVar45 = (lVar74 - iVar20) * lVar45;
              iVar40 = iVar53 - iVar19;
              iVar30 = (iVar27 + iVar1) - iVar19;
              bVar82 = bflo->arr[1];
              bVar9 = bflo->arr[2];
              pdVar2 = pdVar21 + lVar22 * (iVar42 - iVar20);
              pdVar3 = pdVar21 + (iVar56 - iVar20) * lVar22;
              bVar10 = bfhi->arr[1];
              bVar11 = bfhi->arr[2];
              pdVar4 = pdVar21 + lVar22 * (iVar78 - iVar20);
              lVar79 = (long)pdVar21 + lVar54 + lVar41 + lVar77 * -8 + lVar66 * 8;
              lVar6 = (long)pdVar21 + lVar41 + lVar52 + lVar77 * -8 + lVar66 * 8;
              lVar37 = (long)pdVar21 + lVar54 + lVar36 + lVar77 * -8 + lVar66 * 8;
              lVar7 = (long)pdVar21 + lVar63 + lVar45 + lVar77 * -8 + lVar66 * 8;
              lVar24 = lVar45 + lVar77 * -8 + lVar66 * 8;
              lVar46 = (long)pdVar21 + lVar36 + lVar52 + lVar77 * -8 + lVar66 * 8;
              bVar12 = bflo->arr[0];
              lVar65 = 0;
              bVar13 = bfhi->arr[0];
              do {
                if ((((long)(int)local_168 <= lVar66 + lVar65) && (local_168._4_4_ <= iVar23)) &&
                   ((local_160 <= iVar16 &&
                    (((lVar66 + lVar65 <= (long)local_15c[0] && (iVar23 <= local_15c[1])) &&
                     (iVar16 <= (int)uStack_154)))))) goto LAB_0066ac3f;
                bVar87 = lVar34 == lVar65;
                iVar73 = (int)lVar65;
                lVar48 = lVar79;
                if ((iVar23 == iVar42 && bVar87) && (iVar16 == iVar51)) {
                  if ((bVar12 & 1U) == 0) {
                    if (((bVar82 | bVar9) & 1U) == 0) goto LAB_0066a57b;
                    if ((bVar82 & 1U) == 0) {
                      if ((bVar9 & 1U) == 0) goto LAB_0066ac3f;
LAB_0066a979:
                      uVar8 = *(undefined8 *)
                               ((long)pdVar21 +
                               lVar65 * 8 + lVar75 + lVar54 + lVar77 * -8 + lVar66 * 8);
                      uVar89 = (undefined4)uVar8;
                      uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                    }
                    else {
joined_r0x0066a605:
                      lVar47 = lVar59 + lVar41 + lVar77 * -8;
                      if ((bVar9 & 1U) != 0) {
                        lVar47 = lVar59 + lVar75 + lVar77 * -8;
                      }
                      uVar8 = *(undefined8 *)((long)pdVar21 + lVar65 * 8 + lVar47 + lVar66 * 8);
                      uVar89 = (undefined4)uVar8;
                      uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                    }
                  }
                  else {
                    if ((bVar82 & 1U) == 0) {
                      if ((bVar9 & 1U) == 0) {
                        lVar47 = (long)(iVar30 + iVar73);
                        pdVar38 = pdVar2 + lVar60;
                      }
                      else {
                        lVar47 = (long)(iVar30 + iVar73);
                        pdVar38 = pdVar2 + lVar61;
                      }
                    }
                    else if ((bVar9 & 1U) == 0) {
                      lVar47 = (long)(iVar30 + iVar73);
                      pdVar38 = pdVar3 + lVar60;
                    }
                    else {
                      lVar47 = (long)(iVar30 + iVar73);
                      pdVar38 = pdVar3 + lVar61;
                    }
                    uVar89 = SUB84(pdVar38[lVar47],0);
                    uVar90 = (undefined4)((ulong)pdVar38[lVar47] >> 0x20);
                  }
                  goto LAB_0066a9f0;
                }
LAB_0066a57b:
                bVar88 = lVar33 == lVar65;
                if ((iVar23 == iVar42 && bVar88) && (iVar16 == iVar51)) {
                  if ((bVar13 & 1U) == 0) {
                    if (((bVar82 | bVar9) & 1U) != 0) {
                      if ((bVar82 & 1U) != 0) goto joined_r0x0066a605;
                      if ((bVar9 & 1U) != 0) goto LAB_0066a979;
                      goto LAB_0066ac3f;
                    }
                    goto LAB_0066a61e;
                  }
                  if ((bVar82 & 1U) == 0) {
                    if ((bVar9 & 1U) == 0) {
                      lVar48 = (long)(iVar40 + iVar73);
                      pdVar38 = pdVar2 + lVar60;
                    }
                    else {
                      lVar48 = (long)(iVar40 + iVar73);
                      pdVar38 = pdVar2 + lVar61;
                    }
                  }
                  else if ((bVar9 & 1U) == 0) {
                    lVar48 = (long)(iVar40 + iVar73);
                    pdVar38 = pdVar3 + lVar60;
                  }
                  else {
                    lVar48 = (long)(iVar40 + iVar73);
                    pdVar38 = pdVar3 + lVar61;
                  }
                  uVar89 = SUB84(pdVar38[lVar48],0);
                  uVar90 = (undefined4)((ulong)pdVar38[lVar48] >> 0x20);
                  lVar48 = lVar79;
LAB_0066ac36:
                  *(ulong *)(lVar48 + lVar65 * 8) = CONCAT44(uVar90,uVar89);
                }
                else {
LAB_0066a61e:
                  lVar48 = lVar6;
                  pdVar38 = pdVar4;
                  if ((bVar87 && iVar23 == iVar78) && (iVar16 == iVar51)) {
                    if ((bVar12 & 1U) != 0) {
                      if ((bVar10 & 1U) == 0) {
                        lVar47 = (long)(iVar30 + iVar73);
                      }
                      else {
                        lVar47 = (long)(iVar30 + iVar73);
LAB_0066a6d4:
                        pdVar38 = pdVar21 + (iVar50 - iVar20) * lVar22;
                      }
LAB_0066a8c2:
                      lVar72 = lVar60;
                      if ((bVar9 & 1U) != 0) {
                        lVar72 = lVar61;
                      }
                      uVar89 = SUB84(pdVar38[lVar47 + lVar72],0);
                      uVar90 = (undefined4)((ulong)pdVar38[lVar47 + lVar72] >> 0x20);
                      goto LAB_0066a9f0;
                    }
                    if (((bVar10 | bVar9) & 1U) == 0) goto LAB_0066a68b;
LAB_0066a761:
                    if ((bVar10 & 1U) == 0) {
                      if ((bVar9 & 1U) == 0) goto LAB_0066ac3f;
                      uVar8 = *(undefined8 *)
                               ((long)pdVar21 +
                               lVar65 * 8 + lVar52 + lVar75 + lVar77 * -8 + lVar66 * 8);
                      uVar89 = (undefined4)uVar8;
                      uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                      goto LAB_0066a9f0;
                    }
                    lVar48 = lVar41 + lVar64 + lVar77 * -8;
                    if ((bVar9 & 1U) != 0) {
                      lVar48 = lVar75 + lVar64 + lVar77 * -8;
                    }
                    uVar8 = *(undefined8 *)((long)pdVar21 + lVar65 * 8 + lVar48 + lVar66 * 8);
                    uVar89 = (undefined4)uVar8;
                    uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                    lVar48 = lVar6;
                    goto LAB_0066ac36;
                  }
LAB_0066a68b:
                  if ((bVar88 && iVar23 == iVar78) && (iVar16 == iVar51)) {
                    if ((bVar13 & 1U) != 0) {
                      lVar47 = (long)(iVar40 + iVar73);
                      if ((bVar10 & 1U) != 0) goto LAB_0066a6d4;
                      goto LAB_0066a8c2;
                    }
                    if (((bVar10 | bVar9) & 1U) != 0) goto LAB_0066a761;
                  }
                  lVar48 = lVar37;
                  if ((iVar23 == iVar42 && bVar87) && iVar16 == iVar49) {
                    iVar31 = iVar30;
                    if ((bVar12 & 1U) != 0) {
LAB_0066a904:
                      pdVar38 = pdVar2;
                      if ((bVar82 & 1U) != 0) {
                        pdVar38 = pdVar3;
                      }
                      lVar47 = lVar67;
                      if ((bVar11 & 1U) != 0) {
                        lVar47 = lVar68;
                      }
                      uVar89 = SUB84(pdVar38[(iVar31 + iVar73) + lVar47],0);
                      uVar90 = (undefined4)((ulong)pdVar38[(iVar31 + iVar73) + lVar47] >> 0x20);
                      goto LAB_0066a9f0;
                    }
                    if (((bVar82 | bVar11) & 1U) == 0) goto LAB_0066a79f;
LAB_0066aa36:
                    if ((bVar82 & 1U) == 0) {
                      if ((bVar11 & 1U) == 0) goto LAB_0066ac3f;
                      uVar8 = *(undefined8 *)
                               ((long)pdVar21 +
                               lVar65 * 8 + lVar44 + lVar54 + lVar77 * -8 + lVar66 * 8);
                      uVar89 = (undefined4)uVar8;
                      uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                      goto LAB_0066a9f0;
                    }
                    lVar48 = lVar36 + lVar59 + lVar77 * -8;
                    if ((bVar11 & 1U) != 0) {
                      lVar48 = lVar44 + lVar59 + lVar77 * -8;
                    }
                    uVar8 = *(undefined8 *)((long)pdVar21 + lVar65 * 8 + lVar48 + lVar66 * 8);
                    uVar89 = (undefined4)uVar8;
                    uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                    lVar48 = lVar37;
                    goto LAB_0066ac36;
                  }
LAB_0066a79f:
                  if ((iVar23 == iVar42 && bVar88) && iVar16 == iVar49) {
                    iVar31 = iVar40;
                    if ((bVar13 & 1U) != 0) goto LAB_0066a904;
                    if (((bVar82 | bVar11) & 1U) != 0) goto LAB_0066aa36;
                  }
                  if ((bVar87 && iVar23 == iVar78) && iVar16 == iVar49) {
                    lVar48 = lVar46;
                    if ((bVar12 & 1U) == 0) {
                      if (((bVar10 | bVar11) & 1U) == 0) goto LAB_0066a7c9;
                      if ((bVar10 & 1U) != 0) {
                        if ((bVar11 & 1U) == 0) {
                          uVar8 = *(undefined8 *)
                                   ((long)pdVar21 +
                                   lVar65 * 8 + lVar36 + lVar64 + lVar77 * -8 + lVar66 * 8);
                          uVar89 = (undefined4)uVar8;
                          uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                        }
                        else {
                          uVar8 = *(undefined8 *)
                                   ((long)pdVar21 +
                                   lVar65 * 8 + lVar64 + lVar44 + lVar77 * -8 + lVar66 * 8);
                          uVar89 = (undefined4)uVar8;
                          uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                        }
                        goto LAB_0066ac36;
                      }
                      if ((bVar11 & 1U) == 0) goto LAB_0066ac3f;
                      uVar8 = *(undefined8 *)
                               ((long)pdVar21 +
                               lVar65 * 8 + lVar44 + lVar52 + lVar77 * -8 + lVar66 * 8);
                      uVar89 = (undefined4)uVar8;
                      uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                    }
                    else {
                      if ((bVar10 & 1U) != 0) {
                        pdVar38 = pdVar21 + (iVar50 - iVar20) * lVar22;
                      }
                      lVar47 = lVar67;
                      if ((bVar11 & 1U) != 0) {
                        lVar47 = lVar68;
                      }
                      uVar89 = SUB84(pdVar38[(iVar30 + iVar73) + lVar47],0);
                      uVar90 = (undefined4)((ulong)pdVar38[(iVar30 + iVar73) + lVar47] >> 0x20);
                    }
                    goto LAB_0066a9f0;
                  }
LAB_0066a7c9:
                  iVar31 = iVar49;
                  if ((bVar88 && iVar23 == iVar78) && iVar16 == iVar49) {
                    if ((bVar13 & 1U) == 0) {
                      if (((bVar10 | bVar11) & 1U) == 0) goto LAB_0066a7e5;
                      if ((bVar10 & 1U) == 0) {
                        if ((bVar11 & 1U) == 0) goto LAB_0066ac3f;
                        iVar31 = (a->begin).x;
                        iVar73 = (a->begin).y;
                        iVar71 = iVar78;
LAB_0066af96:
                        lVar48 = (long)iVar31;
                        iVar57 = (a->begin).z;
                        lVar47 = ((long)iVar71 - (long)iVar73) * a->jstride;
                        lVar72 = a->kstride * 8;
                        uVar8 = *(undefined8 *)
                                 ((long)pdVar21 +
                                 lVar65 * 8 +
                                 (iVar62 - iVar57) * lVar72 + lVar47 * 8 + lVar48 * -8 + lVar66 * 8)
                        ;
                        uVar89 = (undefined4)uVar8;
                        uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                        iVar73 = iVar49;
LAB_0066afe0:
                        *(ulong *)((long)pdVar21 +
                                  lVar65 * 8 +
                                  (iVar73 - iVar57) * lVar72 + lVar47 * 8 + lVar48 * -8 + lVar66 * 8
                                  ) = CONCAT44(uVar90,uVar89);
                        goto LAB_0066ac3f;
                      }
                      lVar72 = (long)(a->begin).x;
                      iVar71 = (a->begin).y;
                      lVar48 = a->jstride;
                      lVar47 = a->kstride;
                      iVar73 = (a->begin).z;
                      lVar69 = (long)(iVar78 - iVar71);
                      if ((bVar11 & 1U) == 0) {
LAB_0066b9db:
                        lVar47 = lVar47 * (iVar31 - iVar73);
                        iVar73 = local_29c;
LAB_0066b9ed:
                        uVar8 = *(undefined8 *)
                                 ((long)pdVar21 +
                                 lVar65 * 8 +
                                 (long)(iVar73 - iVar71) * lVar48 * 8 + lVar47 * 8 + lVar72 * -8 +
                                 lVar66 * 8);
                        uVar89 = (undefined4)uVar8;
                        uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                        lVar48 = lVar48 * 8 * lVar69 + lVar47 * 8;
                      }
                      else {
LAB_0066abc9:
                        lVar47 = lVar47 * 8;
                        lVar80 = (iVar62 - iVar73) * lVar47;
                        iVar31 = local_29c;
LAB_0066abe7:
                        lVar48 = lVar48 * 8;
                        uVar8 = *(undefined8 *)
                                 ((long)pdVar21 +
                                 lVar65 * 8 +
                                 (iVar31 - iVar71) * lVar48 + lVar80 + lVar72 * -8 + lVar66 * 8);
                        uVar89 = (undefined4)uVar8;
                        uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                        iVar31 = iVar49;
LAB_0066ac0d:
                        lVar48 = (iVar31 - iVar73) * lVar47 + lVar48 * lVar69;
                      }
                      *(ulong *)((long)pdVar21 + lVar65 * 8 + lVar48 + lVar72 * -8 + lVar66 * 8) =
                           CONCAT44(uVar90,uVar89);
                    }
                    else {
                      iVar31 = (a->begin).x;
                      lVar72 = (long)((iVar53 + iVar73) - iVar31);
                      iVar73 = (a->begin).y;
                      lVar48 = a->jstride;
                      lVar47 = a->kstride;
                      iVar71 = (a->begin).z;
                      if (bfhi->arr[1] == true) {
                        lVar69 = (iVar50 - iVar73) * lVar48;
                        if (bfhi->arr[2] != false) {
                          uVar89 = SUB84(pdVar21[lVar69 + lVar72 + (iVar28 - iVar71) * lVar47],0);
                          uVar90 = (undefined4)
                                   ((ulong)pdVar21[lVar69 + lVar72 + (iVar28 - iVar71) * lVar47] >>
                                   0x20);
                          lVar48 = lVar48 * (iVar78 - iVar73);
                          goto LAB_0066adc2;
                        }
                        lVar47 = lVar47 * (iVar49 - iVar71);
                        uVar89 = SUB84(pdVar21[lVar69 + lVar72 + lVar47],0);
                        uVar90 = (undefined4)((ulong)pdVar21[lVar69 + lVar72 + lVar47] >> 0x20);
                        lVar48 = lVar48 * (iVar78 - iVar73);
LAB_0066b01b:
                        lVar48 = lVar47 * 8 + lVar48 * 8;
                      }
                      else {
                        lVar48 = lVar48 * (iVar78 - iVar73);
                        if (bfhi->arr[2] == false) {
                          lVar47 = lVar47 * (iVar49 - iVar71);
                          uVar89 = SUB84(pdVar21[lVar48 + lVar72 + lVar47],0);
                          uVar90 = (undefined4)((ulong)pdVar21[lVar48 + lVar72 + lVar47] >> 0x20);
                          goto LAB_0066b01b;
                        }
                        uVar89 = SUB84(pdVar21[lVar48 + lVar72 + (iVar28 - iVar71) * lVar47],0);
                        uVar90 = (undefined4)
                                 ((ulong)pdVar21[lVar48 + lVar72 + (iVar28 - iVar71) * lVar47] >>
                                 0x20);
LAB_0066adc2:
                        lVar48 = (iVar49 - iVar71) * lVar47 * 8 + lVar48 * 8;
                      }
                      *(ulong *)((long)pdVar21 +
                                lVar65 * 8 + lVar48 + (long)iVar31 * -8 + lVar66 * 8) =
                           CONCAT44(uVar90,uVar89);
                    }
                  }
                  else {
LAB_0066a7e5:
                    if ((lVar34 == lVar65) && (iVar23 == iVar42)) {
                      if ((bVar12 & 1U) != 0) {
                        iVar73 = (a->begin).x;
                        iVar31 = (a->begin).y;
                        lVar48 = a->jstride;
                        lVar47 = (lVar35 - (a->begin).z) * a->kstride;
                        if (bflo->arr[1] == true) {
                          uVar89 = SUB84(pdVar21[(iVar56 - iVar31) * lVar48 +
                                                 (iVar26 - iVar73) + lVar47],0);
                          uVar90 = (undefined4)
                                   ((ulong)pdVar21[(iVar56 - iVar31) * lVar48 +
                                                   (iVar26 - iVar73) + lVar47] >> 0x20);
                          pdVar38 = pdVar21 + (iVar42 - iVar31) * lVar48;
                        }
                        else {
                          pdVar38 = pdVar21 + lVar48 * (iVar42 - iVar31);
                          uVar89 = SUB84(pdVar38[(iVar26 - iVar73) + lVar47],0);
                          uVar90 = (undefined4)((ulong)pdVar38[(iVar26 - iVar73) + lVar47] >> 0x20);
                        }
                        pdVar38[(lVar76 - iVar73) + lVar47] = (double)CONCAT44(uVar90,uVar89);
                        goto LAB_0066ac3f;
                      }
                      if ((bVar82 & 1U) == 0) goto LAB_0066acb4;
                      if (bflo->arr[1] != true) goto LAB_0066ac3f;
                      iVar73 = (a->begin).x;
                      lVar48 = lVar76;
LAB_0066ae1f:
                      lVar48 = lVar48 - iVar73;
                      iVar73 = (a->begin).y;
                      lVar47 = a->jstride;
                      lVar72 = (lVar35 - (a->begin).z) * a->kstride;
                      uVar89 = SUB84(pdVar21[(iVar56 - iVar73) * lVar47 + lVar48 + lVar72],0);
                      uVar90 = (undefined4)
                               ((ulong)pdVar21[(iVar56 - iVar73) * lVar47 + lVar48 + lVar72] >> 0x20
                               );
                      iVar31 = iVar42;
LAB_0066b200:
                      pdVar21[(iVar31 - iVar73) * lVar47 + lVar48 + lVar72] =
                           (double)CONCAT44(uVar90,uVar89);
                    }
                    else {
LAB_0066acb4:
                      if ((lVar33 == lVar65) && (iVar23 == iVar42)) {
                        if ((bVar13 & 1U) == 0) {
                          if ((bVar82 & 1U) == 0) goto LAB_0066ae70;
                          if (bflo->arr[1] == true) {
                            iVar73 = (a->begin).x;
                            lVar48 = lVar32;
                            goto LAB_0066ae1f;
                          }
                        }
                        else {
                          iVar73 = (a->begin).x;
                          lVar72 = (long)(int)(iVar18 - ((uint)bVar81 + iVar73));
                          iVar31 = (a->begin).y;
                          lVar48 = a->jstride;
                          lVar47 = (lVar35 - (a->begin).z) * a->kstride;
                          if (bflo->arr[1] == true) {
                            uVar89 = SUB84(pdVar21[(iVar56 - iVar31) * lVar48 + lVar72 + lVar47],0);
                            uVar90 = (undefined4)
                                     ((ulong)pdVar21[(iVar56 - iVar31) * lVar48 + lVar72 + lVar47]
                                     >> 0x20);
                            pdVar38 = pdVar21 + (iVar42 - iVar31) * lVar48;
                          }
                          else {
                            pdVar38 = pdVar21 + lVar48 * (iVar42 - iVar31);
                            uVar89 = SUB84(pdVar38[lVar72 + lVar47],0);
                            uVar90 = (undefined4)((ulong)pdVar38[lVar72 + lVar47] >> 0x20);
                          }
                          pdVar38[(lVar32 - iVar73) + lVar47] = (double)CONCAT44(uVar90,uVar89);
                        }
                      }
                      else {
LAB_0066ae70:
                        if ((lVar34 == lVar65) && (iVar23 == iVar78)) {
                          if ((bVar12 & 1U) == 0) {
                            if ((bVar10 & 1U) == 0) goto LAB_0066b075;
                            if (bfhi->arr[1] != true) goto LAB_0066ac3f;
                            iVar73 = (a->begin).x;
                            lVar48 = lVar76;
LAB_0066b1b4:
                            lVar48 = lVar48 - iVar73;
                            iVar73 = (a->begin).y;
                            lVar47 = a->jstride;
                            lVar72 = (lVar35 - (a->begin).z) * a->kstride;
                            uVar89 = SUB84(pdVar21[(iVar50 - iVar73) * lVar47 + lVar48 + lVar72],0);
                            uVar90 = (undefined4)
                                     ((ulong)pdVar21[(iVar50 - iVar73) * lVar47 + lVar48 + lVar72]
                                     >> 0x20);
                            iVar31 = iVar78;
                            goto LAB_0066b200;
                          }
                          iVar73 = (a->begin).x;
                          iVar31 = (a->begin).y;
                          lVar48 = a->jstride;
                          lVar47 = (lVar35 - (a->begin).z) * a->kstride;
                          if (bfhi->arr[1] == true) {
                            uVar89 = SUB84(pdVar21[(iVar50 - iVar31) * lVar48 +
                                                   (iVar26 - iVar73) + lVar47],0);
                            uVar90 = (undefined4)
                                     ((ulong)pdVar21[(iVar50 - iVar31) * lVar48 +
                                                     (iVar26 - iVar73) + lVar47] >> 0x20);
                            pdVar38 = pdVar21 + (iVar78 - iVar31) * lVar48;
                          }
                          else {
                            pdVar38 = pdVar21 + lVar48 * (iVar78 - iVar31);
                            uVar89 = SUB84(pdVar38[(iVar26 - iVar73) + lVar47],0);
                            uVar90 = (undefined4)
                                     ((ulong)pdVar38[(iVar26 - iVar73) + lVar47] >> 0x20);
                          }
                          pdVar38[(lVar76 - iVar73) + lVar47] = (double)CONCAT44(uVar90,uVar89);
                        }
                        else {
LAB_0066b075:
                          if ((lVar33 == lVar65) && (iVar23 == iVar78)) {
                            if ((bVar13 & 1U) == 0) {
                              if ((bVar10 & 1U) != 0) {
                                if (bfhi->arr[1] == true) {
                                  iVar73 = (a->begin).x;
                                  lVar48 = lVar32;
                                  goto LAB_0066b1b4;
                                }
                                goto LAB_0066ac3f;
                              }
                              goto LAB_0066b22c;
                            }
                            iVar73 = (a->begin).x;
                            lVar69 = (long)(int)(iVar18 - ((uint)bVar81 + iVar73));
                            iVar31 = (a->begin).y;
                            lVar72 = a->jstride;
                            lVar48 = (lVar35 - (a->begin).z) * a->kstride;
                            lVar47 = lVar32 - iVar73;
                            if (bfhi->arr[1] == true) {
                              uVar89 = SUB84(pdVar21[(iVar50 - iVar31) * lVar72 + lVar69 + lVar48],0
                                            );
                              uVar90 = (undefined4)
                                       ((ulong)pdVar21[(iVar50 - iVar31) * lVar72 + lVar69 + lVar48]
                                       >> 0x20);
                              pdVar38 = pdVar21 + (iVar78 - iVar31) * lVar72;
                            }
                            else {
                              pdVar38 = pdVar21 + lVar72 * (iVar78 - iVar31);
                              pdVar70 = pdVar38 + lVar69;
LAB_0066b753:
                              uVar89 = SUB84(pdVar70[lVar48],0);
                              uVar90 = (undefined4)((ulong)pdVar70[lVar48] >> 0x20);
                            }
LAB_0066b851:
                            pdVar38[lVar47 + lVar48] = (double)CONCAT44(uVar90,uVar89);
                          }
                          else {
LAB_0066b22c:
                            if ((lVar34 == lVar65) && (iVar16 == iVar51)) {
                              if ((bVar12 & 1U) == 0) {
                                if ((bVar9 & 1U) == 0) goto LAB_0066b325;
                                if (bflo->arr[2] != true) goto LAB_0066ac3f;
                                iVar73 = (a->begin).x;
                                lVar48 = lVar76;
LAB_0066b418:
                                iVar31 = (a->begin).z;
                                lVar47 = a->kstride;
                                pdVar38 = pdVar21 + (lVar74 - (a->begin).y) * a->jstride +
                                                    (lVar48 - iVar73);
                                uVar89 = SUB84(pdVar38[(iVar29 - iVar31) * lVar47],0);
                                uVar90 = (undefined4)
                                         ((ulong)pdVar38[(iVar29 - iVar31) * lVar47] >> 0x20);
                                iVar73 = iVar51;
LAB_0066b692:
                                pdVar38[(iVar73 - iVar31) * lVar47] =
                                     (double)CONCAT44(uVar90,uVar89);
                              }
                              else {
                                iVar31 = (a->begin).x;
                                iVar73 = (a->begin).z;
                                lVar48 = a->kstride;
                                pdVar38 = pdVar21 + (lVar74 - (a->begin).y) * a->jstride;
                                lVar47 = lVar76 - iVar31;
                                iVar71 = iVar51;
                                if (bflo->arr[2] != true) {
LAB_0066b745:
                                  lVar48 = lVar48 * (iVar71 - iVar73);
                                  pdVar70 = pdVar38 + (iVar26 - iVar31);
                                  goto LAB_0066b753;
                                }
                                lVar72 = (iVar29 - iVar73) * lVar48;
                                pdVar70 = pdVar38 + (iVar26 - iVar31);
LAB_0066b3be:
                                uVar89 = SUB84(pdVar70[lVar72],0);
                                uVar90 = (undefined4)((ulong)pdVar70[lVar72] >> 0x20);
                                iVar31 = iVar51;
LAB_0066b5ea:
                                pdVar38[lVar47 + (iVar31 - iVar73) * lVar48] =
                                     (double)CONCAT44(uVar90,uVar89);
                              }
                            }
                            else {
LAB_0066b325:
                              if ((lVar33 == lVar65) && (iVar16 == iVar51)) {
                                if ((bVar13 & 1U) == 0) {
                                  if ((bVar9 & 1U) != 0) {
                                    if (bflo->arr[2] != true) goto LAB_0066ac3f;
                                    iVar73 = (a->begin).x;
                                    lVar48 = lVar32;
                                    goto LAB_0066b418;
                                  }
                                  goto LAB_0066b475;
                                }
                                iVar31 = (a->begin).x;
                                iVar73 = (a->begin).z;
                                lVar48 = a->kstride;
                                pdVar38 = pdVar21 + (lVar74 - (a->begin).y) * a->jstride;
                                pdVar70 = pdVar38 + (int)(iVar18 - ((uint)bVar81 + iVar31));
                                lVar47 = lVar32 - iVar31;
                                iVar31 = iVar51;
                                if (bflo->arr[2] == true) {
                                  lVar72 = (iVar29 - iVar73) * lVar48;
                                  goto LAB_0066b3be;
                                }
LAB_0066b841:
                                lVar48 = lVar48 * (iVar31 - iVar73);
                                uVar89 = SUB84(pdVar70[lVar48],0);
                                uVar90 = (undefined4)((ulong)pdVar70[lVar48] >> 0x20);
                                goto LAB_0066b851;
                              }
LAB_0066b475:
                              if ((lVar34 == lVar65) && (iVar16 == iVar49)) {
                                if ((bVar12 & 1U) != 0) {
                                  iVar31 = (a->begin).x;
                                  iVar73 = (a->begin).z;
                                  lVar48 = a->kstride;
                                  pdVar38 = pdVar21 + (lVar74 - (a->begin).y) * a->jstride;
                                  lVar47 = lVar76 - iVar31;
                                  iVar71 = iVar49;
                                  if (bfhi->arr[2] != true) goto LAB_0066b745;
                                  lVar72 = (iVar28 - iVar73) * lVar48;
                                  pdVar70 = pdVar38 + (iVar26 - iVar31);
LAB_0066b5df:
                                  uVar89 = SUB84(pdVar70[lVar72],0);
                                  uVar90 = (undefined4)((ulong)pdVar70[lVar72] >> 0x20);
                                  iVar31 = iVar49;
                                  goto LAB_0066b5ea;
                                }
                                if ((bVar11 & 1U) == 0) goto LAB_0066b545;
                                if (bfhi->arr[2] != true) goto LAB_0066ac3f;
                                iVar73 = (a->begin).x;
                                lVar48 = lVar76;
LAB_0066b63a:
                                iVar31 = (a->begin).z;
                                lVar47 = a->kstride;
                                pdVar38 = pdVar21 + (lVar74 - (a->begin).y) * a->jstride +
                                                    (lVar48 - iVar73);
                                uVar89 = SUB84(pdVar38[(iVar28 - iVar31) * lVar47],0);
                                uVar90 = (undefined4)
                                         ((ulong)pdVar38[(iVar28 - iVar31) * lVar47] >> 0x20);
                                iVar73 = iVar49;
                                goto LAB_0066b692;
                              }
LAB_0066b545:
                              if ((lVar33 == lVar65) && (iVar16 == iVar49)) {
                                if ((bVar13 & 1U) != 0) {
                                  iVar31 = (a->begin).x;
                                  iVar73 = (a->begin).z;
                                  lVar48 = a->kstride;
                                  pdVar38 = pdVar21 + (lVar74 - (a->begin).y) * a->jstride;
                                  pdVar70 = pdVar38 + (int)(iVar18 - ((uint)bVar81 + iVar31));
                                  lVar47 = lVar32 - iVar31;
                                  iVar31 = iVar49;
                                  if (bfhi->arr[2] == true) {
                                    lVar72 = (iVar28 - iVar73) * lVar48;
                                    goto LAB_0066b5df;
                                  }
                                  goto LAB_0066b841;
                                }
                                if ((bVar11 & 1U) != 0) {
                                  if (bfhi->arr[2] != true) goto LAB_0066ac3f;
                                  iVar73 = (a->begin).x;
                                  lVar48 = lVar32;
                                  goto LAB_0066b63a;
                                }
                              }
                              if (bVar85 && bVar84) {
                                if ((bVar82 & 1U) == 0) {
                                  if ((bVar9 & 1U) == 0) goto LAB_0066b78e;
                                  if (bflo->arr[2] != true) goto LAB_0066ac3f;
                                  iVar73 = (a->begin).x;
                                  iVar31 = (a->begin).y;
                                  iVar71 = iVar42;
LAB_0066b89f:
                                  lVar48 = (long)iVar73;
                                  iVar57 = (a->begin).z;
                                  lVar47 = ((long)iVar71 - (long)iVar31) * a->jstride;
                                  lVar72 = a->kstride * 8;
                                  uVar8 = *(undefined8 *)
                                           ((long)pdVar21 +
                                           lVar65 * 8 +
                                           (local_258 - iVar57) * lVar72 + lVar47 * 8 + lVar48 * -8
                                           + lVar66 * 8);
                                  uVar89 = (undefined4)uVar8;
                                  uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                                  iVar73 = iVar51;
                                  goto LAB_0066afe0;
                                }
                                lVar72 = (long)(a->begin).x;
                                iVar71 = (a->begin).y;
                                lVar48 = a->jstride;
                                lVar47 = a->kstride;
                                iVar73 = (a->begin).z;
                                lVar69 = (long)(iVar42 - iVar71);
                                iVar31 = iVar51;
                                if (bflo->arr[2] == true) {
                                  lVar47 = lVar47 * 8;
                                  lVar48 = lVar48 * 8;
                                  uVar8 = *(undefined8 *)
                                           ((long)pdVar21 +
                                           lVar65 * 8 +
                                           (local_254 - iVar71) * lVar48 +
                                           (local_258 - iVar73) * lVar47 + lVar72 * -8 + lVar66 * 8)
                                  ;
                                  uVar89 = (undefined4)uVar8;
                                  uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                                  goto LAB_0066ac0d;
                                }
LAB_0066bb1d:
                                lVar47 = lVar47 * (iVar31 - iVar73);
                                iVar73 = local_254;
                                goto LAB_0066b9ed;
                              }
LAB_0066b78e:
                              if (bVar86 && bVar84) {
                                if ((bVar10 & 1U) == 0) {
                                  if ((bVar9 & 1U) == 0) goto LAB_0066b8eb;
                                  if (bflo->arr[2] == true) {
                                    iVar73 = (a->begin).x;
                                    iVar31 = (a->begin).y;
                                    iVar71 = iVar78;
                                    goto LAB_0066b89f;
                                  }
                                }
                                else {
                                  lVar72 = (long)(a->begin).x;
                                  iVar71 = (a->begin).y;
                                  lVar48 = a->jstride;
                                  lVar47 = a->kstride;
                                  iVar73 = (a->begin).z;
                                  lVar69 = (long)(iVar78 - iVar71);
                                  iVar31 = iVar51;
                                  if (bflo->arr[2] != true) goto LAB_0066b9db;
                                  *(undefined8 *)
                                   ((long)pdVar21 +
                                   lVar65 * 8 +
                                   lVar48 * 8 * lVar69 + (long)(iVar51 - iVar73) * lVar47 * 8 +
                                   lVar72 * -8 + lVar66 * 8) =
                                       *(undefined8 *)
                                        ((long)pdVar21 +
                                        lVar65 * 8 +
                                        (long)(local_29c - iVar71) * lVar48 * 8 +
                                        (long)(local_258 - iVar73) * lVar47 * 8 + lVar72 * -8 +
                                        lVar66 * 8);
                                }
                                goto LAB_0066ac3f;
                              }
LAB_0066b8eb:
                              if (bVar85 && bVar83) {
                                if ((bVar82 & 1U) == 0) {
                                  if ((bVar11 & 1U) != 0) {
                                    if (bfhi->arr[2] == true) {
                                      iVar31 = (a->begin).x;
                                      iVar73 = (a->begin).y;
                                      iVar71 = iVar42;
                                      goto LAB_0066af96;
                                    }
                                    goto LAB_0066ac3f;
                                  }
                                  goto LAB_0066b98c;
                                }
                                lVar72 = (long)(a->begin).x;
                                iVar71 = (a->begin).y;
                                lVar48 = a->jstride;
                                lVar47 = a->kstride;
                                iVar73 = (a->begin).z;
                                lVar69 = (long)(iVar42 - iVar71);
                                if (bfhi->arr[2] != true) goto LAB_0066bb1d;
                                lVar47 = lVar47 * 8;
                                lVar80 = (iVar62 - iVar73) * lVar47;
                                iVar31 = local_254;
                                goto LAB_0066abe7;
                              }
LAB_0066b98c:
                              if (bVar86 && bVar83) {
                                if ((bVar10 & 1U) != 0) {
                                  lVar72 = (long)(a->begin).x;
                                  iVar71 = (a->begin).y;
                                  lVar48 = a->jstride;
                                  lVar47 = a->kstride;
                                  iVar73 = (a->begin).z;
                                  lVar69 = (long)(iVar78 - iVar71);
                                  if (bfhi->arr[2] == true) goto LAB_0066abc9;
                                  goto LAB_0066b9db;
                                }
                                if ((bVar11 & 1U) != 0) {
                                  iVar73 = (a->begin).z;
                                  lVar48 = a->kstride * 8;
                                  *(undefined8 *)
                                   ((long)pdVar21 + lVar65 * 8 + (iVar49 - iVar73) * lVar48 + lVar24
                                   ) = *(undefined8 *)
                                        ((long)pdVar21 +
                                        lVar65 * 8 + (iVar62 - iVar73) * lVar48 + lVar24);
                                  goto LAB_0066ac3f;
                                }
                              }
                              if ((lVar34 == lVar65 & bVar12) == 1) {
                                pdVar21[lVar43 + lVar58 + (lVar76 - lVar77)] =
                                     pdVar21[lVar43 + lVar58 + (iVar26 - iVar19)];
                              }
                              else if ((lVar33 == lVar65 & bVar13) == 1) {
                                pdVar21[lVar43 + lVar58 + (lVar32 - lVar77)] =
                                     pdVar21[lVar43 + lVar58 + (int)(iVar18 - ((uint)bVar81 + iVar19
                                                                              ))];
                              }
                              else {
                                lVar48 = lVar7;
                                if ((bVar85 & bVar82) == 0) {
                                  lVar47 = (long)pdVar21 +
                                           lVar63 + lVar64 + lVar77 * -8 + lVar66 * 8;
                                  if ((((bVar86 & bVar10) == 0) &&
                                      (lVar47 = (long)pdVar21 +
                                                lVar45 + lVar75 + lVar77 * -8 + lVar66 * 8,
                                      (bVar84 & bVar9) == 0)) &&
                                     (lVar47 = (long)pdVar21 +
                                               lVar45 + lVar44 + lVar77 * -8 + lVar66 * 8,
                                     (bVar83 & bVar11) == 0)) goto LAB_0066ac3f;
                                  uVar8 = *(undefined8 *)(lVar47 + lVar65 * 8);
                                  uVar89 = (undefined4)uVar8;
                                  uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                                }
                                else {
                                  uVar8 = *(undefined8 *)
                                           ((long)pdVar21 +
                                           lVar65 * 8 + lVar63 + lVar59 + lVar77 * -8 + lVar66 * 8);
                                  uVar89 = (undefined4)uVar8;
                                  uVar90 = (undefined4)((ulong)uVar8 >> 0x20);
                                }
LAB_0066a9f0:
                                *(ulong *)(lVar48 + lVar65 * 8) = CONCAT44(uVar90,uVar89);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
LAB_0066ac3f:
                lVar65 = lVar65 + 1;
              } while ((iVar17 - iVar14) + 3 != (int)lVar65);
            }
            local_254 = local_254 + 1;
            local_29c = local_29c + 1;
            bVar82 = iVar23 != iVar25;
            iVar23 = iVar23 + 1;
          } while (bVar82);
        }
        local_258 = local_258 + 1;
        iVar62 = iVar62 + 1;
        bVar82 = iVar16 != iVar39;
        iVar16 = iVar16 + 1;
      } while (bVar82);
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}